

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::dragDropTree(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QModelIndex *data;
  QAbstractItemModelTester *pQVar8;
  int j_1;
  int iVar9;
  int j_4;
  uint uVar10;
  int j;
  QModelIndex *pQVar11;
  int i;
  long lVar12;
  initializer_list<QModelIndex> args_00;
  initializer_list<QModelIndex> args_01;
  value_type args;
  GenericModel destination;
  GenericModel source;
  QArrayData *d;
  QModelIndex parIdx;
  QSignalSpy *columnSpies [2];
  QSignalSpy *rowSpies [2];
  QSignalSpy rowsAboutToBeInsertedSpy;
  QSignalSpy columnsAboutToBeInsertedSpy;
  QSignalSpy rowsInsertedSpy;
  QSignalSpy columnsInsertedSpy;
  anon_union_24_3_e3d07ef4_for_data local_398;
  undefined8 local_380;
  anon_union_24_3_e3d07ef4_for_data local_378;
  undefined8 local_360;
  undefined8 local_358;
  QModelIndex local_350;
  uint local_334;
  QModelIndex local_330;
  QModelIndex local_318;
  undefined8 local_300;
  undefined8 local_2f8;
  long *plStack_2f0;
  QArrayData *local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  ulong local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  long *plStack_2b8;
  uint local_2ac;
  undefined1 local_2a8 [16];
  long *local_298;
  ulong local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  PrivateShared *local_270;
  undefined8 uStack_268;
  long local_260;
  QSignalSpy *local_258 [5];
  undefined1 local_230 [40];
  QArrayData *local_208;
  long local_1f8;
  QArrayData *local_1f0;
  QObject local_1d8 [40];
  undefined1 local_1b0 [40];
  QArrayData *local_188;
  long local_178;
  QArrayData *local_170;
  QObject local_158 [40];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  GenericModel::GenericModel((GenericModel *)&local_318,(QObject *)0x0);
  GenericModel::GenericModel((GenericModel *)&local_330,(QObject *)0x0);
  pQVar8 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (pQVar8,(QAbstractItemModel *)&local_318,QtTest,(QObject *)&local_318);
  *(undefined ***)pQVar8 = &PTR_metaObject_001659f8;
  pQVar8 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (pQVar8,(QAbstractItemModel *)&local_330,QtTest,(QObject *)&local_330);
  *(undefined ***)pQVar8 = &PTR_metaObject_001659f8;
  local_230._0_8_ = -NAN;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  GenericModel::insertColumns((int)&local_318,0,(QModelIndex *)0x2);
  local_230._0_8_ = -NAN;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_2ac = 0;
  GenericModel::insertRows((int)&local_318,0,(QModelIndex *)0x5);
  local_290 = 10;
  local_2d0 = 0;
  local_358 = (QModelIndex *)((ulong)local_358._4_4_ << 0x20);
  while( true ) {
    local_230._0_8_ = -NAN;
    local_230._8_8_ = 0;
    local_230._16_8_ = 0;
    iVar4 = GenericModel::rowCount(&local_318);
    if (iVar4 <= (int)local_358) break;
    iVar4 = 0;
    while( true ) {
      local_230._0_8_ = -NAN;
      local_230._8_8_ = 0;
      local_230._16_8_ = 0;
      iVar5 = GenericModel::columnCount(&local_318);
      iVar6 = (int)&local_318;
      iVar7 = (int)(QVariant *)&local_130;
      iVar9 = (int)(QVariant *)local_230;
      if (iVar5 <= iVar4) break;
      local_1b0._0_8_ = -NAN;
      local_1b0._8_8_ = 0;
      local_1b0._16_8_ = 0;
      GenericModel::index(iVar7,iVar6,(QModelIndex *)((ulong)local_358 & 0xffffffff));
      QVariant::QVariant((QVariant *)local_230,(int)local_2d0 + iVar4);
      GenericModel::setData(&local_318,(QVariant *)&local_130,iVar9);
      QVariant::~QVariant((QVariant *)local_230);
      local_1b0._0_8_ = (PrivateShared *)0xffffffffffffffff;
      local_1b0._8_8_ = 0;
      local_1b0._16_8_ = 0;
      GenericModel::index(iVar7,iVar6,(QModelIndex *)((ulong)local_358 & 0xffffffff));
      QVariant::QVariant((QVariant *)local_230,(int)local_290 + iVar4);
      GenericModel::setData(&local_318,(QVariant *)&local_130,iVar9);
      QVariant::~QVariant((QVariant *)local_230);
      iVar4 = iVar4 + 1;
    }
    local_230._0_8_ = -NAN;
    local_230._8_8_ = 0;
    local_230._16_8_ = 0;
    GenericModel::index(iVar7,iVar6,(QModelIndex *)((ulong)local_358 & 0xffffffff));
    GenericModel::insertColumns(iVar6,0,(QModelIndex *)0x2);
    GenericModel::insertRows(iVar6,0,(QModelIndex *)0x3);
    pQVar11 = (QModelIndex *)0x0;
    local_334 = local_2ac;
    while( true ) {
      iVar4 = GenericModel::rowCount(&local_318);
      if (iVar4 <= (int)pQVar11) break;
      uVar10 = local_334;
      for (iVar4 = 0; iVar5 = GenericModel::columnCount(&local_318), iVar4 < iVar5;
          iVar4 = iVar4 + 1) {
        GenericModel::index((int)local_1b0,iVar6,pQVar11);
        QVariant::QVariant((QVariant *)local_230,uVar10);
        GenericModel::setData(&local_318,(QVariant *)local_1b0,iVar9);
        QVariant::~QVariant((QVariant *)local_230);
        uVar10 = uVar10 + 10;
      }
      pQVar11 = (QModelIndex *)(ulong)((int)pQVar11 + 1);
      local_334 = local_334 + 1;
    }
    local_358 = (QModelIndex *)CONCAT44(local_358._4_4_,(int)local_358 + 1);
    local_290 = (ulong)((int)local_290 + 10);
    local_2d0 = (ulong)((int)local_2d0 + 10);
    local_2ac = local_2ac + 100;
  }
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_230,(QObject *)&local_330,
             "2rowsAboutToBeInserted(QModelIndex, int, int)");
  cVar2 = QTest::qVerify(local_1f8 != 0,"rowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbad);
  if (cVar2 == '\0') goto LAB_00149756;
  QSignalSpy::QSignalSpy(&local_130,(QObject *)&local_330,"2rowsInserted(QModelIndex, int, int)");
  cVar2 = QTest::qVerify(local_130.sig.d.size != 0,"rowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbaf);
  if (cVar2 != '\0') {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)local_1b0,(QObject *)&local_330,
               "2columnsAboutToBeInserted(QModelIndex, int, int)");
    cVar2 = QTest::qVerify(local_178 != 0,"columnsAboutToBeInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0xbb1);
    if (cVar2 != '\0') {
      QSignalSpy::QSignalSpy
                (&local_b0,(QObject *)&local_330,"2columnsInserted(QModelIndex, int, int)");
      local_398._forAlignment = -NAN;
      local_398._8_8_ = 0;
      local_398._16_8_ = 0;
      local_258[0] = (QSignalSpy *)local_1b0;
      local_258[1] = &local_b0;
      local_258[2] = (QSignalSpy *)local_230;
      local_258[3] = &local_130;
      GenericModel::index((int)&local_270,(int)&local_318,(QModelIndex *)0x1);
      local_350.r = -1;
      local_350.c = -1;
      local_350.i = 0;
      local_350.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&local_378,(int)&local_318,(QModelIndex *)0x0);
      local_398._8_8_ = QArrayData::allocate(&local_2e8,0x18,8,1,KeepSize);
      local_398.shared = (PrivateShared *)local_2e8;
      *(undefined8 *)((long)&(((QVariant *)local_398._8_8_)->d).data + 0x10) = local_378._16_8_;
      (((QVariant *)local_398._8_8_)->d).data.shared = local_378.shared;
      *(undefined8 *)((long)&(((QVariant *)local_398._8_8_)->d).data + 8) = local_378._8_8_;
      local_398._16_8_ = 1;
      local_358 = (QModelIndex *)GenericModel::mimeData((QList *)&local_318);
      if ((QArrayData *)local_398.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_398.shared = *(int *)local_398.shared + -1;
        UNLOCK();
        if (*(int *)local_398.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_398.shared,0x18,8);
        }
      }
      cVar2 = QTest::qVerify(local_358 != (QModelIndex *)0x0,"mimeData","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,3000);
      if (cVar2 != '\0') {
        local_398._forAlignment = -NAN;
        local_398._8_8_ = (QVariant *)0x0;
        local_398._16_8_ = 0;
        bVar3 = (bool)GenericModel::dropMimeData
                                ((QMimeData *)&local_330,(DropAction)local_358,1,0,
                                 (QModelIndex *)0x0);
        cVar2 = QTest::qVerify(bVar3,
                               "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0xbb9);
        if (cVar2 != '\0') {
          local_398._forAlignment = -NAN;
          local_398._8_8_ = (QVariant *)0x0;
          local_398._16_8_ = 0;
          iVar4 = GenericModel::rowCount(&local_330);
          cVar2 = QTest::qCompare(iVar4,1,"destination.rowCount()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0xbba);
          if (cVar2 != '\0') {
            local_398._forAlignment = -NAN;
            local_398._8_8_ = (QVariant *)0x0;
            local_398._16_8_ = 0;
            iVar4 = GenericModel::columnCount(&local_330);
            cVar2 = QTest::qCompare(iVar4,1,"destination.columnCount()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0xbbb);
            if (cVar2 != '\0') {
              local_378._forAlignment = -NAN;
              local_378._8_8_ = 0;
              local_378._16_8_ = 0;
              iVar9 = (int)&local_398;
              GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
              iVar4 = GenericModel::rowCount(&local_330);
              local_2e8 = (QArrayData *)0xffffffffffffffff;
              local_2e0 = 0;
              uStack_2d8 = 0;
              GenericModel::index((int)&local_350,(int)&local_318,(QModelIndex *)0x0);
              iVar5 = GenericModel::rowCount(&local_318);
              cVar2 = QTest::qCompare(iVar4,iVar5,"destination.rowCount(destination.index(0, 0))",
                                      "source.rowCount(source.index(0, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0xbbc);
              if (cVar2 != '\0') {
                local_378._forAlignment = -NAN;
                local_378._8_8_ = 0;
                local_378._16_8_ = 0;
                GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                iVar4 = GenericModel::columnCount(&local_330);
                local_2e8 = (QArrayData *)0xffffffffffffffff;
                local_2e0 = 0;
                uStack_2d8 = 0;
                GenericModel::index((int)&local_350,(int)&local_318,(QModelIndex *)0x0);
                iVar5 = GenericModel::columnCount(&local_318);
                cVar2 = QTest::qCompare(iVar4,iVar5,
                                        "destination.columnCount(destination.index(0, 0))",
                                        "source.columnCount(source.index(0, 0))",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0xbbd);
                if (cVar2 != '\0') {
                  uVar10 = 0;
                  while( true ) {
                    local_378._forAlignment = -NAN;
                    local_378._8_8_ = 0;
                    local_378._16_8_ = 0;
                    iVar4 = (int)&local_330;
                    GenericModel::index(iVar9,iVar4,(QModelIndex *)0x0);
                    local_334 = GenericModel::rowCount(&local_330);
                    if ((int)local_334 <= (int)uVar10) break;
                    iVar5 = 0;
LAB_00147b7c:
                    local_378._forAlignment = -NAN;
                    local_378._8_8_ = 0;
                    local_378._16_8_ = 0;
                    GenericModel::index(iVar9,iVar4,(QModelIndex *)0x0);
                    iVar6 = GenericModel::columnCount(&local_330);
                    if (iVar5 < iVar6) {
                      local_300 = 0xffffffffffffffff;
                      local_2f8 = 0;
                      plStack_2f0 = (long *)0x0;
                      GenericModel::index((int)&local_2e8,iVar4,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_350,iVar4,(QModelIndex *)(ulong)uVar10);
                      if (local_350.m == (QAbstractItemModel *)0x0) {
                        local_398.shared = (PrivateShared *)0x0;
                        local_398._8_8_ = (QVariant *)0x0;
                        local_398._16_8_ = 0;
                        local_380 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_350.m + 0x90))
                                  (&local_398,local_350.m,&local_350,0);
                      }
                      iVar6 = QVariant::toInt((bool *)local_398.data);
                      local_288 = 0xffffffffffffffff;
                      local_280 = 0;
                      uStack_278 = 0;
                      GenericModel::index((int)local_2a8,(int)&local_318,(QModelIndex *)0x0);
                      GenericModel::index((int)&local_2c8,(int)&local_318,
                                          (QModelIndex *)(ulong)uVar10);
                      if (plStack_2b8 == (long *)0x0) {
                        local_378.shared = (PrivateShared *)0x0;
                        local_378._8_8_ = 0;
                        local_378._16_8_ = 0;
                        local_360 = 2;
                      }
                      else {
                        (**(code **)(*plStack_2b8 + 0x90))(&local_378,plStack_2b8,&local_2c8,0);
                      }
                      iVar7 = QVariant::toInt((bool *)local_378.data);
                      cVar2 = QTest::qCompare(iVar6,iVar7,
                                              "destination.index(i, j, destination.index(0, 0)).data().toInt()"
                                              ,
                                              "source.index(i, j, source.index(0, 0)).data().toInt()"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0xbc0);
                      QVariant::~QVariant((QVariant *)&local_378);
                      QVariant::~QVariant((QVariant *)&local_398);
                      if (cVar2 != '\0') goto code_r0x00147d2d;
                      goto LAB_00147ebf;
                    }
                    uVar10 = uVar10 + 1;
                  }
LAB_00147eca:
                  local_2e8 = (QArrayData *)0xffffffffffffffff;
                  local_2e0 = 0;
                  uStack_2d8 = 0;
                  GenericModel::index((int)&local_350,(int)&local_330,(QModelIndex *)0x0);
                  if (local_350.m == (QAbstractItemModel *)0x0) {
                    local_398.shared = (PrivateShared *)0x0;
                    local_398._8_8_ = (QVariant *)0x0;
                    local_398._16_8_ = 0;
                    local_380 = 2;
                  }
                  else {
                    (**(code **)(*(long *)local_350.m + 0x90))(&local_398,local_350.m,&local_350,0);
                  }
                  iVar4 = QVariant::toInt((bool *)local_398.data);
                  local_2c8 = 0xffffffffffffffff;
                  local_2c0 = 0;
                  plStack_2b8 = (long *)0x0;
                  GenericModel::index((int)&local_300,(int)&local_318,(QModelIndex *)0x0);
                  if (plStack_2f0 == (long *)0x0) {
                    local_378.shared = (PrivateShared *)0x0;
                    local_378._8_8_ = 0;
                    local_378._16_8_ = 0;
                    local_360 = 2;
                  }
                  else {
                    (**(code **)(*plStack_2f0 + 0x90))(&local_378,plStack_2f0,&local_300,0);
                  }
                  iVar5 = QVariant::toInt((bool *)local_378.data);
                  cVar2 = QTest::qCompare(iVar4,iVar5,"destination.index(0, 0).data().toInt()",
                                          "source.index(0, 0).data().toInt()",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0xbc5);
                  QVariant::~QVariant((QVariant *)&local_378);
                  QVariant::~QVariant((QVariant *)&local_398);
                  if (cVar2 != '\0') {
                    local_2e8 = (QArrayData *)0xffffffffffffffff;
                    local_2e0 = 0;
                    uStack_2d8 = 0;
                    GenericModel::index((int)&local_350,(int)&local_330,(QModelIndex *)0x0);
                    if (local_350.m == (QAbstractItemModel *)0x0) {
                      local_398.shared = (PrivateShared *)0x0;
                      local_398._8_8_ = (QVariant *)0x0;
                      local_398._16_8_ = 0;
                      local_380 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_350.m + 0x90))
                                (&local_398,local_350.m,&local_350,0x100);
                    }
                    iVar4 = QVariant::toInt((bool *)local_398.data);
                    local_2c8 = 0xffffffffffffffff;
                    local_2c0 = 0;
                    plStack_2b8 = (long *)0x0;
                    GenericModel::index((int)&local_300,(int)&local_318,(QModelIndex *)0x0);
                    if (plStack_2f0 == (long *)0x0) {
                      local_378.shared = (PrivateShared *)0x0;
                      local_378._8_8_ = 0;
                      local_378._16_8_ = 0;
                      local_360 = 2;
                    }
                    else {
                      (**(code **)(*plStack_2f0 + 0x90))(&local_378,plStack_2f0,&local_300,0x100);
                    }
                    iVar5 = QVariant::toInt((bool *)local_378.data);
                    cVar2 = QTest::qCompare(iVar4,iVar5,
                                            "destination.index(0, 0).data(Qt::UserRole).toInt()",
                                            "source.index(0, 0).data(Qt::UserRole).toInt()",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0xbc6);
                    QVariant::~QVariant((QVariant *)&local_378);
                    QVariant::~QVariant((QVariant *)&local_398);
                    if (cVar2 != '\0') {
                      lVar12 = 0;
                      do {
                        lVar1 = *(long *)((long)local_258 + lVar12 + 0x10);
                        cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbc8);
                        if (cVar2 == '\0') goto LAB_001495c1;
                        QList<QList<QVariant>_>::takeFirst
                                  ((value_type *)&local_398,
                                   (QList<QList<QVariant>_> *)(lVar1 + 0x10));
                        QVariant::value<QModelIndex>
                                  ((QModelIndex *)&local_378,(QVariant *)local_398._8_8_);
                        bVar3 = true;
                        if ((-1 < (int)local_378._0_4_) && (-1 < (long)local_378.shared)) {
                          bVar3 = local_378._16_8_ == 0;
                        }
                        cVar2 = QTest::qVerify(bVar3,"!args.at(0).value<QModelIndex>().isValid()",""
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0xbca);
                        if (cVar2 == '\0') goto LAB_001495b9;
                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x20));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbcb);
                        if (cVar2 == '\0') goto LAB_001495b9;
                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x40));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbcc);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer
                                  ((QArrayDataPointer<QVariant> *)&local_398);
                        if (cVar2 == '\0') goto LAB_001495c1;
                        lVar12 = lVar12 + 8;
                      } while (lVar12 != 0x10);
                      lVar12 = 0;
                      do {
                        lVar1 = *(long *)((long)local_258 + lVar12);
                        cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbcf);
                        if (cVar2 == '\0') goto LAB_001495c1;
                        QList<QList<QVariant>_>::takeFirst
                                  ((value_type *)&local_398,
                                   (QList<QList<QVariant>_> *)(lVar1 + 0x10));
                        QVariant::value<QModelIndex>
                                  ((QModelIndex *)&local_378,(QVariant *)local_398._8_8_);
                        bVar3 = true;
                        if ((-1 < (int)local_378._0_4_) && (-1 < (long)local_378.shared)) {
                          bVar3 = local_378._16_8_ == 0;
                        }
                        cVar2 = QTest::qVerify(bVar3,"!args.at(0).value<QModelIndex>().isValid()",""
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0xbd1);
                        if (cVar2 == '\0') goto LAB_001495b9;
                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x20));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbd2);
                        if (cVar2 == '\0') goto LAB_001495b9;
                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x40));
                        cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbd3);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer
                                  ((QArrayDataPointer<QVariant> *)&local_398);
                        if (cVar2 == '\0') goto LAB_001495c1;
                        lVar12 = lVar12 + 8;
                      } while (lVar12 != 0x10);
                      QObject::deleteLater();
                      local_378._16_8_ = local_260;
                      local_378.shared = local_270;
                      local_378._8_8_ = uStack_268;
                      args_00._M_len = 1;
                      args_00._M_array = (iterator)&local_378;
                      QList<QModelIndex>::QList((QList<QModelIndex> *)&local_398,args_00);
                      lVar12 = GenericModel::mimeData((QList *)&local_318);
                      if ((QArrayData *)local_398.shared != (QArrayData *)0x0) {
                        LOCK();
                        *(int *)local_398.shared = *(int *)local_398.shared + -1;
                        UNLOCK();
                        if (*(int *)local_398.shared == 0) {
                          QArrayData::deallocate((QArrayData *)local_398.shared,0x18,8);
                        }
                      }
                      cVar2 = QTest::qVerify(lVar12 != 0,"mimeData","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0xbd8);
                      if (cVar2 != '\0') {
                        local_378._forAlignment = -NAN;
                        local_378._8_8_ = 0;
                        local_378._16_8_ = 0;
                        GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                        bVar3 = (bool)GenericModel::dropMimeData
                                                ((QMimeData *)&local_330,(DropAction)lVar12,1,0,
                                                 (QModelIndex *)0x0);
                        cVar2 = QTest::qVerify(bVar3,
                                               "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0))"
                                               ,"",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0xbd9);
                        if (cVar2 != '\0') {
                          local_398._forAlignment = -NAN;
                          local_398._8_8_ = (QVariant *)0x0;
                          local_398._16_8_ = 0;
                          iVar4 = GenericModel::rowCount(&local_330);
                          cVar2 = QTest::qCompare(iVar4,1,"destination.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbda);
                          if (cVar2 != '\0') {
                            local_398._forAlignment = -NAN;
                            local_398._8_8_ = (QVariant *)0x0;
                            local_398._16_8_ = 0;
                            iVar4 = GenericModel::columnCount(&local_330);
                            cVar2 = QTest::qCompare(iVar4,1,"destination.columnCount()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdb);
                            if (cVar2 != '\0') {
                              local_378._forAlignment = -NAN;
                              local_378._8_8_ = 0;
                              local_378._16_8_ = 0;
                              GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                              iVar4 = GenericModel::rowCount(&local_330);
                              local_2e8 = (QArrayData *)0xffffffffffffffff;
                              local_2e0 = 0;
                              uStack_2d8 = 0;
                              GenericModel::index((int)&local_350,(int)&local_318,(QModelIndex *)0x0
                                                 );
                              iVar5 = GenericModel::rowCount(&local_318);
                              cVar2 = QTest::qCompare(iVar4,iVar5 + 1,
                                                                                                            
                                                  "destination.rowCount(destination.index(0, 0))",
                                                  "source.rowCount(source.index(0, 0)) + 1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdc);
                              if (cVar2 != '\0') {
                                local_378._forAlignment = -NAN;
                                local_378._8_8_ = 0;
                                local_378._16_8_ = 0;
                                GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                                iVar4 = GenericModel::columnCount(&local_330);
                                local_2e8 = (QArrayData *)0xffffffffffffffff;
                                local_2e0 = 0;
                                uStack_2d8 = 0;
                                GenericModel::index((int)&local_350,(int)&local_318,
                                                    (QModelIndex *)0x0);
                                iVar5 = GenericModel::columnCount(&local_318);
                                cVar2 = QTest::qCompare(iVar4,iVar5,
                                                                                                                
                                                  "destination.columnCount(destination.index(0, 0))"
                                                  ,"source.columnCount(source.index(0, 0))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdd);
                                if (cVar2 != '\0') {
                                  local_358 = (QModelIndex *)0x1;
                                  while( true ) {
                                    local_378._forAlignment = -NAN;
                                    local_378._8_8_ = 0;
                                    local_378._16_8_ = 0;
                                    iVar5 = (int)&local_330;
                                    GenericModel::index(iVar9,iVar5,(QModelIndex *)0x0);
                                    iVar4 = GenericModel::rowCount(&local_330);
                                    local_2d0 = CONCAT44(local_2d0._4_4_,iVar4);
                                    if (iVar4 <= (int)local_358) break;
                                    local_334 = (int)local_358 - 1;
                                    iVar4 = 0;
LAB_001486be:
                                    local_378._forAlignment = -NAN;
                                    local_378._8_8_ = 0;
                                    local_378._16_8_ = 0;
                                    GenericModel::index(iVar9,iVar5,(QModelIndex *)0x0);
                                    iVar6 = GenericModel::columnCount(&local_330);
                                    if (iVar4 < iVar6) {
                                      local_300 = 0xffffffffffffffff;
                                      local_2f8 = 0;
                                      plStack_2f0 = (long *)0x0;
                                      GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
                                      GenericModel::index((int)&local_350,iVar5,local_358);
                                      if (local_350.m == (QAbstractItemModel *)0x0) {
                                        local_398.shared = (PrivateShared *)0x0;
                                        local_398._8_8_ = (QVariant *)0x0;
                                        local_398._16_8_ = 0;
                                        local_380 = 2;
                                      }
                                      else {
                                        (**(code **)(*(long *)local_350.m + 0x90))
                                                  (&local_398,local_350.m,&local_350,0);
                                      }
                                      iVar6 = QVariant::toInt((bool *)local_398.data);
                                      local_288 = 0xffffffffffffffff;
                                      local_280 = 0;
                                      uStack_278 = 0;
                                      GenericModel::index((int)local_2a8,(int)&local_318,
                                                          (QModelIndex *)0x0);
                                      GenericModel::index((int)&local_2c8,(int)&local_318,
                                                          (QModelIndex *)(ulong)local_334);
                                      if (plStack_2b8 == (long *)0x0) {
                                        local_378.shared = (PrivateShared *)0x0;
                                        local_378._8_8_ = 0;
                                        local_378._16_8_ = 0;
                                        local_360 = 2;
                                      }
                                      else {
                                        (**(code **)(*plStack_2b8 + 0x90))
                                                  (&local_378,plStack_2b8,&local_2c8,0);
                                      }
                                      iVar7 = QVariant::toInt((bool *)local_378.data);
                                      cVar2 = QTest::qCompare(iVar6,iVar7,
                                                                                                                            
                                                  "destination.index(i, j, destination.index(0, 0)).data().toInt()"
                                                  ,
                                                  "source.index(i - 1, j, source.index(0, 0)).data().toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe0);
                                      QVariant::~QVariant((QVariant *)&local_378);
                                      QVariant::~QVariant((QVariant *)&local_398);
                                      if (cVar2 != '\0') goto code_r0x00148876;
                                      goto LAB_00148a10;
                                    }
                                    local_358 = (QModelIndex *)(ulong)((int)local_358 + 1);
                                  }
LAB_00148a21:
                                  local_350.r = -1;
                                  local_350.c = -1;
                                  local_350.i = 0;
                                  local_350.m = (QAbstractItemModel *)0x0;
                                  GenericModel::index((int)&local_378,(int)&local_330,
                                                      (QModelIndex *)0x0);
                                  GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                                  iVar4 = GenericModel::rowCount(&local_330);
                                  iVar5 = GenericModel::rowCount(&local_318);
                                  cVar2 = QTest::qCompare(iVar4,iVar5,
                                                                                                                    
                                                  "destination.rowCount(destination.index(0, 0, destination.index(0, 0)))"
                                                  ,"source.rowCount(parIdx)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe5);
                                  if (cVar2 != '\0') {
                                    local_350.r = -1;
                                    local_350.c = -1;
                                    local_350.i = 0;
                                    local_350.m = (QAbstractItemModel *)0x0;
                                    GenericModel::index((int)&local_378,(int)&local_330,
                                                        (QModelIndex *)0x0);
                                    GenericModel::index(iVar9,(int)&local_330,(QModelIndex *)0x0);
                                    iVar4 = GenericModel::columnCount(&local_330);
                                    iVar5 = GenericModel::columnCount(&local_318);
                                    cVar2 = QTest::qCompare(iVar4,iVar5,
                                                                                                                        
                                                  "destination.columnCount(destination.index(0, 0, destination.index(0, 0)))"
                                                  ,"source.columnCount(parIdx)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe6);
                                    if (cVar2 != '\0') {
                                      uVar10 = 1;
                                      while( true ) {
                                        local_350.r = -1;
                                        local_350.c = -1;
                                        local_350.i = 0;
                                        local_350.m = (QAbstractItemModel *)0x0;
                                        iVar5 = (int)&local_330;
                                        GenericModel::index((int)&local_378,iVar5,(QModelIndex *)0x0
                                                           );
                                        GenericModel::index(iVar9,iVar5,(QModelIndex *)0x0);
                                        iVar4 = GenericModel::rowCount(&local_330);
                                        local_358 = (QModelIndex *)CONCAT44(local_358._4_4_,iVar4);
                                        if (iVar4 <= (int)uVar10) break;
                                        iVar4 = 0;
LAB_00148ba2:
                                        local_350.r = -1;
                                        local_350.c = -1;
                                        local_350.i = 0;
                                        local_350.m = (QAbstractItemModel *)0x0;
                                        GenericModel::index((int)&local_378,iVar5,(QModelIndex *)0x0
                                                           );
                                        GenericModel::index(iVar9,iVar5,(QModelIndex *)0x0);
                                        iVar6 = GenericModel::columnCount(&local_330);
                                        if (iVar4 < iVar6) {
                                          local_2c8 = 0xffffffffffffffff;
                                          local_2c0 = 0;
                                          plStack_2b8 = (long *)0x0;
                                          GenericModel::index((int)&local_300,iVar5,
                                                              (QModelIndex *)0x0);
                                          GenericModel::index((int)&local_2e8,iVar5,
                                                              (QModelIndex *)0x0);
                                          GenericModel::index((int)&local_350,iVar5,
                                                              (QModelIndex *)(ulong)uVar10);
                                          if (local_350.m == (QAbstractItemModel *)0x0) {
                                            local_398.shared = (PrivateShared *)0x0;
                                            local_398._8_8_ = (QVariant *)0x0;
                                            local_398._16_8_ = 0;
                                            local_380 = 2;
                                          }
                                          else {
                                            (**(code **)(*(long *)local_350.m + 0x90))
                                                      (&local_398,local_350.m,&local_350,0);
                                          }
                                          iVar6 = QVariant::toInt((bool *)local_398.data);
                                          GenericModel::index((int)local_2a8,(int)&local_318,
                                                              (QModelIndex *)(ulong)uVar10);
                                          if (local_298 == (long *)0x0) {
                                            local_378.shared = (PrivateShared *)0x0;
                                            local_378._8_8_ = 0;
                                            local_378._16_8_ = 0;
                                            local_360 = 2;
                                          }
                                          else {
                                            (**(code **)(*local_298 + 0x90))
                                                      (&local_378,local_298,local_2a8,0);
                                          }
                                          iVar7 = QVariant::toInt((bool *)local_378.data);
                                          cVar2 = QTest::qCompare(iVar6,iVar7,
                                                                                                                                    
                                                  "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt()"
                                                  ,"source.index(i, j, parIdx).data().toInt()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbea);
                                          QVariant::~QVariant((QVariant *)&local_378);
                                          QVariant::~QVariant((QVariant *)&local_398);
                                          if (cVar2 != '\0') goto code_r0x00148d57;
                                          goto LAB_00148ecc;
                                        }
                                        uVar10 = uVar10 + 1;
                                      }
LAB_00148ed6:
                                      lVar12 = 0;
                                      do {
                                        lVar1 = *(long *)((long)local_258 + lVar12 + 0x10);
                                        cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,
                                                                "spy->count()","1",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf0);
                                        if (cVar2 == '\0') goto LAB_001495c1;
                                        QList<QList<QVariant>_>::takeFirst
                                                  ((value_type *)&local_398,
                                                   (QList<QList<QVariant>_> *)(lVar1 + 0x10));
                                        QVariant::value<QModelIndex>
                                                  ((QModelIndex *)&local_378,
                                                   (QVariant *)local_398._8_8_);
                                        local_2e8 = (QArrayData *)0xffffffffffffffff;
                                        local_2e0 = 0;
                                        uStack_2d8 = 0;
                                        GenericModel::index((int)&local_350,(int)&local_330,
                                                            (QModelIndex *)0x0);
                                        bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                                          ((QModelIndex *)&local_378,&local_350,
                                                           "args.at(0).value<QModelIndex>()",
                                                           "destination.index(0, 0)",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf2);
                                        if (!bVar3) goto LAB_001495b9;
                                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x20));
                                        cVar2 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf3);
                                        if (cVar2 == '\0') goto LAB_001495b9;
                                        iVar4 = QVariant::toInt((bool *)(local_398._8_8_ + 0x40));
                                        cVar2 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf4);
                                        QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                  ((QArrayDataPointer<QVariant> *)&local_398);
                                        if (cVar2 == '\0') goto LAB_001495c1;
                                        lVar12 = lVar12 + 8;
                                      } while (lVar12 != 0x10);
                                      lVar12 = 0;
                                      do {
                                        cVar2 = QTest::qCompare(*(longlong *)
                                                                 (*(long *)((long)local_258 + lVar12
                                                                           ) + 0x20),0,
                                                                "spy->count()","0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf7);
                                        if (cVar2 == '\0') goto LAB_001495c1;
                                        lVar12 = lVar12 + 8;
                                      } while (lVar12 != 0x10);
                                      QObject::deleteLater();
                                      GenericModel::index((int)&local_378,(int)&local_318,
                                                          (QModelIndex *)0x1);
                                      args_01._M_len = 1;
                                      args_01._M_array = (iterator)&local_378;
                                      QList<QModelIndex>::QList
                                                ((QList<QModelIndex> *)&local_398,args_01);
                                      lVar12 = GenericModel::mimeData((QList *)&local_318);
                                      if ((QArrayData *)local_398.shared != (QArrayData *)0x0) {
                                        LOCK();
                                        *(int *)local_398.shared = *(int *)local_398.shared + -1;
                                        UNLOCK();
                                        if (*(int *)local_398.shared == 0) {
                                          QArrayData::deallocate
                                                    ((QArrayData *)local_398.shared,0x18,8);
                                        }
                                      }
                                      cVar2 = QTest::qVerify(lVar12 != 0,"mimeData","",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfb);
                                      if (cVar2 != '\0') {
                                        local_398._forAlignment = -NAN;
                                        local_398._8_8_ = (QVariant *)0x0;
                                        local_398._16_8_ = 0;
                                        bVar3 = (bool)GenericModel::dropMimeData
                                                                ((QMimeData *)&local_330,
                                                                 (DropAction)lVar12,1,0,
                                                                 (QModelIndex *)0x0);
                                        cVar2 = QTest::qVerify(bVar3,
                                                  "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfc);
                                        if (cVar2 != '\0') {
                                          local_398._forAlignment = -NAN;
                                          local_398._8_8_ = (QVariant *)0x0;
                                          local_398._16_8_ = 0;
                                          iVar4 = GenericModel::rowCount(&local_330);
                                          cVar2 = QTest::qCompare(iVar4,2,"destination.rowCount()",
                                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfd);
                                          if (cVar2 != '\0') {
                                            local_398._forAlignment = -NAN;
                                            local_398._8_8_ = (QVariant *)0x0;
                                            local_398._16_8_ = 0;
                                            iVar4 = GenericModel::columnCount(&local_330);
                                            cVar2 = QTest::qCompare(iVar4,1,
                                                  "destination.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfe);
                                            if (cVar2 != '\0') {
                                              local_2e8 = (QArrayData *)0xffffffffffffffff;
                                              local_2e0 = 0;
                                              uStack_2d8 = 0;
                                              GenericModel::index((int)&local_350,(int)&local_330,
                                                                  (QModelIndex *)0x0);
                                              if (local_350.m == (QAbstractItemModel *)0x0) {
                                                local_398.shared = (PrivateShared *)0x0;
                                                local_398._8_8_ = (QVariant *)0x0;
                                                local_398._16_8_ = 0;
                                                local_380 = 2;
                                              }
                                              else {
                                                (**(code **)(*(long *)local_350.m + 0x90))
                                                          (&local_398,local_350.m,&local_350,0);
                                              }
                                              iVar4 = QVariant::toInt((bool *)local_398.data);
                                              GenericModel::index((int)&local_300,(int)&local_318,
                                                                  (QModelIndex *)0x1);
                                              if (plStack_2f0 == (long *)0x0) {
                                                local_378.shared = (PrivateShared *)0x0;
                                                local_378._8_8_ = 0;
                                                local_378._16_8_ = 0;
                                                local_360 = 2;
                                              }
                                              else {
                                                (**(code **)(*plStack_2f0 + 0x90))
                                                          (&local_378,plStack_2f0,&local_300,0);
                                              }
                                              iVar5 = QVariant::toInt((bool *)local_378.data);
                                              cVar2 = QTest::qCompare(iVar4,iVar5,
                                                                                                                                            
                                                  "destination.index(0, 0).data().toInt()",
                                                  "source.index(1, 1, parIdx).data().toInt()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbff);
                                              QVariant::~QVariant((QVariant *)&local_378);
                                              QVariant::~QVariant((QVariant *)&local_398);
                                              if (cVar2 != '\0') {
                                                local_2e8 = (QArrayData *)0xffffffffffffffff;
                                                local_2e0 = 0;
                                                uStack_2d8 = 0;
                                                GenericModel::index((int)&local_350,(int)&local_330,
                                                                    (QModelIndex *)0x0);
                                                if (local_350.m == (QAbstractItemModel *)0x0) {
                                                  local_398.shared = (PrivateShared *)0x0;
                                                  local_398._8_8_ = (QVariant *)0x0;
                                                  local_398._16_8_ = 0;
                                                  local_380 = 2;
                                                }
                                                else {
                                                  (**(code **)(*(long *)local_350.m + 0x90))
                                                            (&local_398,local_350.m,&local_350,0x100
                                                            );
                                                }
                                                iVar4 = QVariant::toInt((bool *)local_398.data);
                                                GenericModel::index((int)&local_300,(int)&local_318,
                                                                    (QModelIndex *)0x1);
                                                if (plStack_2f0 == (long *)0x0) {
                                                  local_378.shared = (PrivateShared *)0x0;
                                                  local_378._8_8_ = 0;
                                                  local_378._16_8_ = 0;
                                                  local_360 = 2;
                                                }
                                                else {
                                                  (**(code **)(*plStack_2f0 + 0x90))
                                                            (&local_378,plStack_2f0,&local_300,0x100
                                                            );
                                                }
                                                iVar5 = QVariant::toInt((bool *)local_378.data);
                                                cVar2 = QTest::qCompare(iVar4,iVar5,
                                                                                                                                                
                                                  "destination.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "source.index(1, 1, parIdx).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc00);
                                                QVariant::~QVariant((QVariant *)&local_378);
                                                QVariant::~QVariant((QVariant *)&local_398);
                                                if (cVar2 != '\0') {
                                                  lVar12 = 0;
                                                  do {
                                                    lVar1 = *(long *)((long)local_258 +
                                                                     lVar12 + 0x10);
                                                    cVar2 = QTest::qCompare(*(longlong *)
                                                                             (lVar1 + 0x20),1,
                                                                            "spy->count()","1",
                                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc02);
                                                  if (cVar2 == '\0') goto LAB_001495c1;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_398,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_378,
                                                             (QVariant *)local_398._8_8_);
                                                  local_350.r = -1;
                                                  local_350.c = -1;
                                                  local_350.i = 0;
                                                  local_350.m = (QAbstractItemModel *)0x0;
                                                  bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_378,
                                                                     &local_350,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","QModelIndex()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc04);
                                                  if (!bVar3) goto LAB_001495b9;
                                                  iVar4 = QVariant::toInt((bool *)(local_398._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar4,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc05);
                                                  if (cVar2 == '\0') goto LAB_001495b9;
                                                  iVar4 = QVariant::toInt((bool *)(local_398._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar4,0,
                                                  "args.at(2).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc06);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_398);
                                                  if (cVar2 == '\0') goto LAB_001495c1;
                                                  lVar12 = lVar12 + 8;
                                                  } while (lVar12 != 0x10);
                                                  lVar12 = 0;
                                                  do {
                                                    cVar2 = QTest::qCompare(*(longlong *)
                                                                             (*(long *)((long)
                                                  local_258 + lVar12) + 0x20),0,"spy->count()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc09);
                                                  if (cVar2 == '\0') goto LAB_001495c1;
                                                  lVar12 = lVar12 + 8;
                                                  } while (lVar12 != 0x10);
                                                  QObject::deleteLater();
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_001495c1;
    }
    goto LAB_00149648;
  }
LAB_001496cf:
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
LAB_00149756:
  local_230._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject(local_1d8);
  if (local_1f0 != (QArrayData *)0x0) {
    LOCK();
    (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1f0,4,8);
    }
  }
  if (local_208 != (QArrayData *)0x0) {
    LOCK();
    (local_208->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_208->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_208->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_208,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)(local_230 + 0x10));
  QObject::~QObject((QObject *)local_230);
  GenericModel::~GenericModel((GenericModel *)&local_330);
  GenericModel::~GenericModel((GenericModel *)&local_318);
  return;
code_r0x00147d2d:
  local_300 = 0xffffffffffffffff;
  local_2f8 = 0;
  plStack_2f0 = (long *)0x0;
  GenericModel::index((int)&local_2e8,iVar4,(QModelIndex *)0x0);
  GenericModel::index((int)&local_350,iVar4,(QModelIndex *)(ulong)uVar10);
  if (local_350.m == (QAbstractItemModel *)0x0) {
    local_398.shared = (PrivateShared *)0x0;
    local_398._8_8_ = (QVariant *)0x0;
    local_398._16_8_ = 0;
    local_380 = 2;
  }
  else {
    (**(code **)(*(long *)local_350.m + 0x90))(&local_398,local_350.m,&local_350,0x100);
  }
  iVar6 = QVariant::toInt((bool *)local_398.data);
  local_288 = 0xffffffffffffffff;
  local_280 = 0;
  uStack_278 = 0;
  GenericModel::index((int)local_2a8,(int)&local_318,(QModelIndex *)0x0);
  GenericModel::index((int)&local_2c8,(int)&local_318,(QModelIndex *)(ulong)uVar10);
  if (plStack_2b8 == (long *)0x0) {
    local_378.shared = (PrivateShared *)0x0;
    local_378._8_8_ = 0;
    local_378._16_8_ = 0;
    local_360 = 2;
  }
  else {
    (**(code **)(*plStack_2b8 + 0x90))(&local_378,plStack_2b8,&local_2c8,0x100);
  }
  iVar7 = QVariant::toInt((bool *)local_378.data);
  cVar2 = QTest::qCompare(iVar6,iVar7,
                          "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                          ,"source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt()",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbc2);
  QVariant::~QVariant((QVariant *)&local_378);
  QVariant::~QVariant((QVariant *)&local_398);
  iVar5 = iVar5 + 1;
  if (cVar2 == '\0') {
LAB_00147ebf:
    if ((int)uVar10 < (int)local_334) goto LAB_001495c1;
    goto LAB_00147eca;
  }
  goto LAB_00147b7c;
code_r0x00148876:
  local_300 = 0xffffffffffffffff;
  local_2f8 = 0;
  plStack_2f0 = (long *)0x0;
  GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
  GenericModel::index((int)&local_350,iVar5,local_358);
  if (local_350.m == (QAbstractItemModel *)0x0) {
    local_398.shared = (PrivateShared *)0x0;
    local_398._8_8_ = (QVariant *)0x0;
    local_398._16_8_ = 0;
    local_380 = 2;
  }
  else {
    (**(code **)(*(long *)local_350.m + 0x90))(&local_398,local_350.m,&local_350,0x100);
  }
  iVar6 = QVariant::toInt((bool *)local_398.data);
  local_288 = 0xffffffffffffffff;
  local_280 = 0;
  uStack_278 = 0;
  GenericModel::index((int)local_2a8,(int)&local_318,(QModelIndex *)0x0);
  GenericModel::index((int)&local_2c8,(int)&local_318,(QModelIndex *)(ulong)local_334);
  if (plStack_2b8 == (long *)0x0) {
    local_378.shared = (PrivateShared *)0x0;
    local_378._8_8_ = 0;
    local_378._16_8_ = 0;
    local_360 = 2;
  }
  else {
    (**(code **)(*plStack_2b8 + 0x90))(&local_378,plStack_2b8,&local_2c8,0x100);
  }
  iVar7 = QVariant::toInt((bool *)local_378.data);
  cVar2 = QTest::qCompare(iVar6,iVar7,
                          "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                          ,"source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt()",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbe2);
  QVariant::~QVariant((QVariant *)&local_378);
  QVariant::~QVariant((QVariant *)&local_398);
  iVar4 = iVar4 + 1;
  if (cVar2 == '\0') {
LAB_00148a10:
    if ((int)local_358 < (int)local_2d0) goto LAB_001495c1;
    goto LAB_00148a21;
  }
  goto LAB_001486be;
code_r0x00148d57:
  local_2c8 = 0xffffffffffffffff;
  local_2c0 = 0;
  plStack_2b8 = (long *)0x0;
  GenericModel::index((int)&local_300,iVar5,(QModelIndex *)0x0);
  GenericModel::index((int)&local_2e8,iVar5,(QModelIndex *)0x0);
  GenericModel::index((int)&local_350,iVar5,(QModelIndex *)(ulong)uVar10);
  if (local_350.m == (QAbstractItemModel *)0x0) {
    local_398.shared = (PrivateShared *)0x0;
    local_398._8_8_ = (QVariant *)0x0;
    local_398._16_8_ = 0;
    local_380 = 2;
  }
  else {
    (**(code **)(*(long *)local_350.m + 0x90))(&local_398,local_350.m,&local_350,0x100);
  }
  iVar6 = QVariant::toInt((bool *)local_398.data);
  GenericModel::index((int)local_2a8,(int)&local_318,(QModelIndex *)(ulong)uVar10);
  if (local_298 == (long *)0x0) {
    local_378.shared = (PrivateShared *)0x0;
    local_378._8_8_ = 0;
    local_378._16_8_ = 0;
    local_360 = 2;
  }
  else {
    (**(code **)(*local_298 + 0x90))(&local_378,local_298,local_2a8,0x100);
  }
  iVar7 = QVariant::toInt((bool *)local_378.data);
  cVar2 = QTest::qCompare(iVar6,iVar7,
                          "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt()"
                          ,"source.index(i, j, parIdx).data(Qt::UserRole).toInt()",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                          ,0xbec);
  QVariant::~QVariant((QVariant *)&local_378);
  QVariant::~QVariant((QVariant *)&local_398);
  iVar4 = iVar4 + 1;
  if (cVar2 == '\0') {
LAB_00148ecc:
    if ((int)uVar10 < (int)local_358) goto LAB_001495c1;
    goto LAB_00148ed6;
  }
  goto LAB_00148ba2;
LAB_001495b9:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_398);
LAB_001495c1:
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
LAB_00149648:
  local_1b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject(local_158);
  if (local_170 != (QArrayData *)0x0) {
    LOCK();
    (local_170->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_170->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_170->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_170,4,8);
    }
  }
  if (local_188 != (QArrayData *)0x0) {
    LOCK();
    (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_188,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)(local_1b0 + 0x10));
  QObject::~QObject((QObject *)local_1b0);
  goto LAB_001496cf;
}

Assistant:

void tst_GenericModel::dragDropTree()
{
    GenericModel source;
    GenericModel destination;
    new ModelTest(&source, &source);
    new ModelTest(&destination, &destination);
    source.insertColumns(0, 2);
    source.insertRows(0, 5);
    for (int i = 0; i < source.rowCount(); ++i) {
        for (int j = 0; j < source.columnCount(); ++j) {
            source.setData(source.index(i, j), (10 * i) + j);
            source.setData(source.index(i, j), (10 * i) + j + 10, Qt::UserRole);
        }
        const QModelIndex parIdx = source.index(i, 0);
        source.insertColumns(0, 2, parIdx);
        source.insertRows(0, 3, parIdx);
        for (int k = 0; k < source.rowCount(parIdx); ++k) {
            for (int j = 0; j < source.columnCount(parIdx); ++j)
                source.setData(source.index(k, j, parIdx), (i * 100) + (10 * j) + k);
        }
    }
    QSignalSpy rowsAboutToBeInsertedSpy(&destination, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeInsertedSpy.isValid());
    QSignalSpy rowsInsertedSpy(&destination, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(rowsInsertedSpy.isValid());
    QSignalSpy columnsAboutToBeInsertedSpy(&destination, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeInsertedSpy.isValid());
    QSignalSpy columnsInsertedSpy(&destination, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QSignalSpy *rowSpies[] = {&rowsAboutToBeInsertedSpy, &rowsInsertedSpy};
    QSignalSpy *columnSpies[] = {&columnsAboutToBeInsertedSpy, &columnsInsertedSpy};
    const QModelIndex parIdx = source.index(1, 0);

    QMimeData *mimeData = source.mimeData({source.index(0, 0)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)));
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 0; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(0, 0).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(0, 0).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    mimeData->deleteLater();

    mimeData = source.mimeData({parIdx});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0)));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)) + 1);
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i - 1, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.rowCount(destination.index(0, 0, destination.index(0, 0))), source.rowCount(parIdx));
    QCOMPARE(destination.columnCount(destination.index(0, 0, destination.index(0, 0))), source.columnCount(parIdx));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0, destination.index(0, 0))); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0, destination.index(0, 0))); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt(),
                     source.index(i, j, parIdx).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt(),
                     source.index(i, j, parIdx).data(Qt::UserRole).toInt());
        }
    }
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), destination.index(0, 0));
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();

    mimeData = source.mimeData({source.index(1, 1, parIdx)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 2);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(1, 1, parIdx).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(1, 1, parIdx).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();
}